

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

int proxy_h2_fr_print(nghttp2_frame *frame,char *buffer,size_t blen)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  char scratch [128];
  undefined1 auStack_98 [128];
  
  uVar3 = (ulong)(frame->hd).type;
  switch(uVar3) {
  case 0:
    uVar5 = (ulong)((frame->hd).flags & 1);
    uVar3 = (ulong)*(uint *)frame;
    uVar6 = (ulong)(frame->rst_stream).error_code;
    pcVar4 = "FRAME[DATA, len=%d, eos=%d, padlen=%d]";
    break;
  case 1:
    uVar3 = (ulong)*(uint *)frame;
    uVar5 = (ulong)((frame->hd).flags >> 2 & 1);
    uVar6 = (ulong)((frame->hd).flags & 1);
    pcVar4 = "FRAME[HEADERS, len=%d, hend=%d, eos=%d]";
    break;
  case 2:
    uVar3 = (ulong)*(uint *)frame;
    uVar5 = (ulong)(frame->hd).flags;
    pcVar4 = "FRAME[PRIORITY, len=%d, flags=%d]";
    goto LAB_006bdfc7;
  case 3:
    uVar5 = (ulong)(frame->hd).flags;
    uVar3 = (ulong)*(uint *)frame;
    uVar6 = (ulong)(frame->rst_stream).error_code;
    pcVar4 = "FRAME[RST_STREAM, len=%d, flags=%d, error=%u]";
    break;
  case 4:
    if (((frame->hd).flags & 1) != 0) {
      iVar2 = curl_msnprintf(buffer,0xff,"FRAME[SETTINGS, ack=1]");
      return iVar2;
    }
    uVar1 = *(uint *)frame;
    pcVar4 = "FRAME[SETTINGS, len=%d]";
    goto LAB_006bdfed;
  case 5:
    uVar3 = (ulong)*(uint *)frame;
    uVar5 = (ulong)((frame->hd).flags >> 2 & 1);
    pcVar4 = "FRAME[PUSH_PROMISE, len=%d, hend=%d]";
    goto LAB_006bdfc7;
  case 6:
    uVar3 = (ulong)*(uint *)frame;
    uVar5 = (ulong)((frame->hd).flags & 1);
    pcVar4 = "FRAME[PING, len=%d, ack=%d]";
LAB_006bdfc7:
    iVar2 = curl_msnprintf(buffer,0xff,pcVar4,uVar3,uVar5);
    return iVar2;
  case 7:
    uVar3 = (frame->push_promise).nvlen;
    __n = 0x7f;
    if (uVar3 < 0x7f) {
      __n = uVar3;
    }
    if (uVar3 != 0) {
      memcpy(auStack_98,(frame->settings).iv,__n);
    }
    auStack_98[__n] = 0;
    iVar2 = curl_msnprintf(buffer,0xff,"FRAME[GOAWAY, error=%d, reason=\'%s\', last_stream=%d]",
                           (ulong)(frame->goaway).error_code,auStack_98,
                           (ulong)(frame->rst_stream).error_code);
    return iVar2;
  case 8:
    uVar1 = (frame->rst_stream).error_code;
    pcVar4 = "FRAME[WINDOW_UPDATE, incr=%d]";
LAB_006bdfed:
    iVar2 = curl_msnprintf(buffer,0xff,pcVar4,(ulong)uVar1);
    return iVar2;
  default:
    uVar5 = (ulong)*(uint *)frame;
    uVar6 = (ulong)(frame->hd).flags;
    pcVar4 = "FRAME[%d, len=%d, flags=%d]";
  }
  iVar2 = curl_msnprintf(buffer,0xff,pcVar4,uVar3,uVar5,uVar6);
  return iVar2;
}

Assistant:

static int proxy_h2_fr_print(const nghttp2_frame *frame,
                             char *buffer, size_t blen)
{
  switch(frame->hd.type) {
    case NGHTTP2_DATA: {
      return msnprintf(buffer, blen,
                       "FRAME[DATA, len=%d, eos=%d, padlen=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_STREAM),
                       (int)frame->data.padlen);
    }
    case NGHTTP2_HEADERS: {
      return msnprintf(buffer, blen,
                       "FRAME[HEADERS, len=%d, hend=%d, eos=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_HEADERS),
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_STREAM));
    }
    case NGHTTP2_PRIORITY: {
      return msnprintf(buffer, blen,
                       "FRAME[PRIORITY, len=%d, flags=%d]",
                       (int)frame->hd.length, frame->hd.flags);
    }
    case NGHTTP2_RST_STREAM: {
      return msnprintf(buffer, blen,
                       "FRAME[RST_STREAM, len=%d, flags=%d, error=%u]",
                       (int)frame->hd.length, frame->hd.flags,
                       frame->rst_stream.error_code);
    }
    case NGHTTP2_SETTINGS: {
      if(frame->hd.flags & NGHTTP2_FLAG_ACK) {
        return msnprintf(buffer, blen, "FRAME[SETTINGS, ack=1]");
      }
      return msnprintf(buffer, blen,
                       "FRAME[SETTINGS, len=%d]", (int)frame->hd.length);
    }
    case NGHTTP2_PUSH_PROMISE: {
      return msnprintf(buffer, blen,
                       "FRAME[PUSH_PROMISE, len=%d, hend=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_HEADERS));
    }
    case NGHTTP2_PING: {
      return msnprintf(buffer, blen,
                       "FRAME[PING, len=%d, ack=%d]",
                       (int)frame->hd.length,
                       frame->hd.flags&NGHTTP2_FLAG_ACK);
    }
    case NGHTTP2_GOAWAY: {
      char scratch[128];
      size_t s_len = sizeof(scratch)/sizeof(scratch[0]);
        size_t len = (frame->goaway.opaque_data_len < s_len)?
                      frame->goaway.opaque_data_len : s_len-1;
        if(len)
          memcpy(scratch, frame->goaway.opaque_data, len);
        scratch[len] = '\0';
        return msnprintf(buffer, blen, "FRAME[GOAWAY, error=%d, reason='%s', "
                         "last_stream=%d]", frame->goaway.error_code,
                         scratch, frame->goaway.last_stream_id);
    }
    case NGHTTP2_WINDOW_UPDATE: {
      return msnprintf(buffer, blen,
                       "FRAME[WINDOW_UPDATE, incr=%d]",
                       frame->window_update.window_size_increment);
    }
    default:
      return msnprintf(buffer, blen, "FRAME[%d, len=%d, flags=%d]",
                       frame->hd.type, (int)frame->hd.length,
                       frame->hd.flags);
  }
}